

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_NtkFindNamesInPlaces(char *pBuffer,Vec_Int_t *vPlaces,Vec_Ptr_t *vPivots)

{
  int iVar1;
  int i_00;
  int *piVar2;
  Vec_Ptr_t *p;
  char *__needle;
  char *pcVar3;
  char *pcVar4;
  char *pPivot;
  char *pSpot;
  char *pName;
  char *pTemp;
  char pLocal [1000];
  int local_44;
  int nFanins;
  int Pos;
  int iObj;
  int k;
  int i;
  Vec_Ptr_t *vNames;
  int *pCounts;
  Vec_Ptr_t *vPivots_local;
  Vec_Int_t *vPlaces_local;
  char *pBuffer_local;
  
  piVar2 = Abc_FrameReadGateCounts();
  p = Vec_PtrAlloc(100);
  for (iObj = 0; iObj < 5; iObj = iObj + 1) {
    piVar2[iObj] = 0;
  }
  iObj = 0;
  do {
    iVar1 = Vec_IntSize(vPlaces);
    if (iVar1 <= iObj + 1) {
      Abc_FrameSetSignalNames(p);
      return;
    }
    iVar1 = Vec_IntEntry(vPlaces,iObj);
    i_00 = Vec_IntEntry(vPlaces,iObj + 1);
    local_44 = 0;
    __needle = (char *)Vec_PtrEntry(vPivots,i_00);
    for (Pos = 0; Pos < 1000; Pos = Pos + 1) {
      if (pBuffer[iVar1 + Pos] == '\n') {
        pLocal[(long)Pos + -8] = '\0';
        break;
      }
      pLocal[(long)Pos + -8] = pBuffer[iVar1 + Pos];
    }
    if (999 < Pos) {
      __assert_fail("k < 1000",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                    ,0x3c6,"void Acb_NtkFindNamesInPlaces(char *, Vec_Int_t *, Vec_Ptr_t *)");
    }
    pcVar3 = strstr((char *)&pTemp,__needle);
    if (pcVar3 == (char *)0x0) {
      printf("Cannot find location of signal \"%s\" in this line.\n",__needle);
    }
    else {
      pName = strtok((char *)&pTemp," \r\n\t,;()");
      while (pName != (char *)0x0) {
        iVar1 = strcmp(pName,"1\'b0");
        if (iVar1 == 0) {
          *piVar2 = *piVar2 + 1;
        }
        else {
          iVar1 = strcmp(pName,"1\'b1");
          if (iVar1 == 0) {
            piVar2[1] = piVar2[1] + 1;
          }
          else {
            iVar1 = strcmp(pName,"buf");
            if ((iVar1 == 0) || (iVar1 = strcmp(pName,"assign"), iVar1 == 0)) {
              piVar2[2] = piVar2[2] + 1;
            }
            else {
              iVar1 = strcmp(pName,"not");
              if (iVar1 == 0) {
                piVar2[3] = piVar2[3] + 1;
              }
              else {
                iVar1 = strcmp(pName,__needle);
                if ((iVar1 != 0) && (pcVar3 < pName)) {
                  local_44 = local_44 + 1;
                  for (Pos = 0; iVar1 = Vec_PtrSize(p), Pos < iVar1; Pos = Pos + 1) {
                    pcVar4 = (char *)Vec_PtrEntry(p,Pos);
                    iVar1 = strcmp(pcVar4,pName);
                    if (iVar1 == 0) break;
                  }
                  iVar1 = Vec_PtrSize(p);
                  if (Pos == iVar1) {
                    pcVar4 = Abc_UtilStrsav(pName);
                    Vec_PtrPush(p,pcVar4);
                  }
                }
              }
            }
          }
        }
        pName = strtok((char *)0x0," \r\n\t,;()");
      }
      if (1 < local_44) {
        piVar2[4] = local_44 + -1 + piVar2[4];
      }
    }
    iObj = iObj + 2;
  } while( true );
}

Assistant:

void Acb_NtkFindNamesInPlaces( char * pBuffer, Vec_Int_t * vPlaces, Vec_Ptr_t * vPivots )
{
    int * pCounts = Abc_FrameReadGateCounts();
    Vec_Ptr_t * vNames = Vec_PtrAlloc( 100 );
    int i, k, iObj, Pos;
    for ( i = 0; i < 5; i++ )
        pCounts[i] = 0;
    Vec_IntForEachEntryDouble( vPlaces, Pos, iObj, i )
    {
        int nFanins = 0;
        char pLocal[1000], * pTemp, * pName, * pSpot;
        char * pPivot = (char *)Vec_PtrEntry(vPivots, iObj);
        for ( k = 0; k < 1000; k++ )
        {
            if ( pBuffer[Pos+k] == '\n' )
            {
                pLocal[k] = 0;
                break;
            }
            else
                pLocal[k] = pBuffer[Pos+k];
        }
        assert( k < 1000 );
        pSpot = strstr( pLocal, pPivot );
        if ( pSpot == NULL )
        {
            printf( "Cannot find location of signal \"%s\" in this line.\n", pPivot );
            continue;
        }
        pTemp = strtok( pLocal, " \r\n\t,;()" );
        while ( pTemp )
        {
            if ( !strcmp(pTemp, "1\'b0") )
                pCounts[0]++;
            else if ( !strcmp(pTemp, "1\'b1") )
                pCounts[1]++;
            else if ( !strcmp(pTemp, "buf") || !strcmp(pTemp, "assign") )
                pCounts[2]++;
            else if ( !strcmp(pTemp, "not") )
                pCounts[3]++;
            else if ( strcmp(pTemp, pPivot) && pTemp > pSpot )
            {
                nFanins++;
                Vec_PtrForEachEntry( char *, vNames, pName, k )
                    if ( !strcmp(pName, pTemp) )
                        break;
                if ( k == Vec_PtrSize(vNames) )
                    Vec_PtrPush( vNames, Abc_UtilStrsav(pTemp) );
            }
            pTemp = strtok( NULL, " \r\n\t,;()" );
        }
        if ( nFanins > 1 )
            pCounts[4] += nFanins-1;
    }
    //printf( "Found %d names\n", Vec_PtrSize(vNames) );
    Abc_FrameSetSignalNames( vNames );
}